

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_itrans_recon_8x8.c
# Opt level: O2

void ihevc_chroma_itrans_recon_8x8
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  WORD16 *pWVar6;
  int iVar7;
  undefined2 uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int local_c8 [4];
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  long local_98;
  long local_90;
  int aiStack_88 [2];
  WORD32 e [4];
  WORD32 o [4];
  
  e[3] = pred_strd;
  e[2] = zero_cols & 0xf0U;
  iVar11 = (uint)((zero_cols & 0xf0U) != 0xf0) * 4 + 4;
  local_ac = 0x53;
  local_9c = 0x24;
  local_b0 = 0x24;
  local_a0 = 0xffffffad;
  local_b4 = 0x40;
  local_a4 = 0x40;
  local_b8 = 0x40;
  local_a8 = 0xffffffc0;
  local_98 = CONCAT44(local_98._4_4_,iVar11);
  pWVar6 = pi2_tmp;
  for (iVar14 = 0; iVar14 != iVar11; iVar14 = iVar14 + 1) {
    if ((zero_cols & 1U) == 0) {
      local_90 = CONCAT44(local_90._4_4_,zero_cols);
      sVar1 = pi2_src[src_strd];
      sVar2 = pi2_src[src_strd * 3];
      sVar3 = pi2_src[src_strd * 5];
      sVar4 = pi2_src[src_strd * 7];
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        aiStack_88[lVar13] =
             (int)g_ai2_ihevc_trans_8[7][lVar13] * (int)sVar4 +
             (int)g_ai2_ihevc_trans_8[5][lVar13] * (int)sVar3 +
             (int)g_ai2_ihevc_trans_8[3][lVar13] * (int)sVar2 +
             (int)g_ai2_ihevc_trans_8[1][lVar13] * (int)sVar1;
      }
      iVar10 = pi2_src[src_strd * 6] * 0x24 + pi2_src[src_strd * 2] * 0x53;
      iVar7 = pi2_src[src_strd * 6] * -0x53 + pi2_src[src_strd * 2] * 0x24;
      iVar12 = pi2_src[src_strd * 4] * 0x40 + *pi2_src * 0x40;
      iVar5 = pi2_src[src_strd * 4] * -0x40 + *pi2_src * 0x40;
      local_c8[0] = iVar12 + iVar10;
      local_c8[3] = iVar12 - iVar10;
      local_c8[1] = iVar5 + iVar7;
      local_c8[2] = iVar5 - iVar7;
      lVar13 = 0xc;
      for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 2) {
        iVar5 = *(int *)((long)local_c8 + lVar9 * 2) + *(int *)((long)aiStack_88 + lVar9 * 2) + 0x40
                >> 7;
        if (iVar5 < -0x7fff) {
          iVar5 = -0x8000;
        }
        uVar8 = (undefined2)iVar5;
        if (0x7ffe < iVar5) {
          uVar8 = 0x7fff;
        }
        *(undefined2 *)((long)pWVar6 + lVar9) = uVar8;
        iVar5 = (*(int *)((long)local_c8 + lVar13) - *(int *)((long)aiStack_88 + lVar13)) + 0x40 >>
                7;
        if (iVar5 < -0x7fff) {
          iVar5 = -0x8000;
        }
        if (0x7ffe < iVar5) {
          iVar5 = 0x7fff;
        }
        *(short *)((long)pWVar6 + lVar9 + 8) = (short)iVar5;
        lVar13 = lVar13 + -4;
      }
    }
    else {
      pWVar6[0] = 0;
      pWVar6[1] = 0;
      pWVar6[2] = 0;
      pWVar6[3] = 0;
      pWVar6[4] = 0;
      pWVar6[5] = 0;
      pWVar6[6] = 0;
      pWVar6[7] = 0;
    }
    pi2_src = pi2_src + 1;
    pWVar6 = pWVar6 + 8;
    zero_cols = zero_cols >> 1;
  }
  local_90 = (long)e[3];
  local_98 = (long)dst_strd;
  if (e[2] == 0xf0) {
    for (iVar11 = 0; iVar11 != 8; iVar11 = iVar11 + 1) {
      sVar1 = pi2_tmp[8];
      sVar2 = pi2_tmp[0x18];
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        aiStack_88[lVar13] =
             (int)g_ai2_ihevc_trans_8[3][lVar13] * (int)sVar2 +
             (int)g_ai2_ihevc_trans_8[1][lVar13] * (int)sVar1;
      }
      iVar14 = (int)pi2_tmp[0x10];
      iVar7 = *pi2_tmp * 0x40;
      iVar5 = *pi2_tmp * 0x40;
      local_c8[0] = iVar5 + iVar14 * 0x53;
      local_c8[3] = iVar5 + iVar14 * -0x53;
      local_c8[1] = iVar7 + iVar14 * 0x24;
      local_c8[2] = iVar7 + iVar14 * -0x24;
      lVar13 = 0xc;
      for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 2) {
        iVar14 = *(int *)((long)local_c8 + lVar9 * 2) + *(int *)((long)aiStack_88 + lVar9 * 2) +
                 0x800 >> 0xc;
        if (iVar14 < -0x7fff) {
          iVar14 = -0x8000;
        }
        if (0x7ffe < iVar14) {
          iVar14 = 0x7fff;
        }
        iVar14 = (uint)pu1_pred[lVar9] + iVar14;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        pu1_dst[lVar9] = (UWORD8)iVar14;
        iVar14 = (*(int *)((long)local_c8 + lVar13) - *(int *)((long)aiStack_88 + lVar13)) + 0x800
                 >> 0xc;
        if (iVar14 < -0x7fff) {
          iVar14 = -0x8000;
        }
        if (0x7ffe < iVar14) {
          iVar14 = 0x7fff;
        }
        iVar14 = (uint)pu1_pred[lVar9 + 8] + iVar14;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        pu1_dst[lVar9 + 8] = (UWORD8)iVar14;
        lVar13 = lVar13 + -4;
      }
      pi2_tmp = pi2_tmp + 1;
      pu1_pred = pu1_pred + local_90;
      pu1_dst = pu1_dst + local_98;
    }
  }
  else {
    for (iVar11 = 0; iVar11 != 8; iVar11 = iVar11 + 1) {
      sVar1 = pi2_tmp[8];
      sVar2 = pi2_tmp[0x18];
      sVar3 = pi2_tmp[0x28];
      sVar4 = pi2_tmp[0x38];
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        aiStack_88[lVar13] =
             (int)g_ai2_ihevc_trans_8[7][lVar13] * (int)sVar4 +
             (int)g_ai2_ihevc_trans_8[5][lVar13] * (int)sVar3 +
             (int)g_ai2_ihevc_trans_8[3][lVar13] * (int)sVar2 +
             (int)g_ai2_ihevc_trans_8[1][lVar13] * (int)sVar1;
      }
      iVar7 = pi2_tmp[0x30] * 0x24 + pi2_tmp[0x10] * 0x53;
      iVar5 = pi2_tmp[0x30] * -0x53 + pi2_tmp[0x10] * 0x24;
      iVar14 = pi2_tmp[0x20] * 0x40 + *pi2_tmp * 0x40;
      iVar10 = pi2_tmp[0x20] * -0x40 + *pi2_tmp * 0x40;
      local_c8[0] = iVar14 + iVar7;
      local_c8[3] = iVar14 - iVar7;
      local_c8[1] = iVar10 + iVar5;
      local_c8[2] = iVar10 - iVar5;
      lVar9 = 0xc;
      for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 2) {
        iVar14 = *(int *)((long)local_c8 + lVar13 * 2) + *(int *)((long)aiStack_88 + lVar13 * 2) +
                 0x800 >> 0xc;
        if (iVar14 < -0x7fff) {
          iVar14 = -0x8000;
        }
        if (0x7ffe < iVar14) {
          iVar14 = 0x7fff;
        }
        iVar14 = (uint)pu1_pred[lVar13] + iVar14;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        pu1_dst[lVar13] = (UWORD8)iVar14;
        iVar14 = (*(int *)((long)local_c8 + lVar9) - *(int *)((long)aiStack_88 + lVar9)) + 0x800 >>
                 0xc;
        if (iVar14 < -0x7fff) {
          iVar14 = -0x8000;
        }
        if (0x7ffe < iVar14) {
          iVar14 = 0x7fff;
        }
        iVar14 = (uint)pu1_pred[lVar13 + 8] + iVar14;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        pu1_dst[lVar13 + 8] = (UWORD8)iVar14;
        lVar9 = lVar9 + -4;
      }
      pi2_tmp = pi2_tmp + 1;
      pu1_pred = pu1_pred + local_90;
      pu1_dst = pu1_dst + local_98;
    }
  }
  return;
}

Assistant:

void ihevc_chroma_itrans_recon_8x8(WORD16 *pi2_src,
                                   WORD16 *pi2_tmp,
                                   UWORD8 *pu1_pred,
                                   UWORD8 *pu1_dst,
                                   WORD32 src_strd,
                                   WORD32 pred_strd,
                                   WORD32 dst_strd,
                                   WORD32 zero_cols,
                                   WORD32 zero_rows)
{
    WORD32 j, k;
    WORD32 e[4], o[4];
    WORD32 ee[2], eo[2];
    WORD32 add;
    WORD32 shift;
    WORD16 *pi2_tmp_orig;
    WORD32 trans_size;
    WORD32 zero_rows_2nd_stage = zero_cols;
    WORD32 row_limit_2nd_stage;
    UNUSED(zero_rows);
    trans_size = TRANS_SIZE_8;

    pi2_tmp_orig = pi2_tmp;

    if((zero_cols & 0xF0) == 0xF0)
        row_limit_2nd_stage = 4;
    else
        row_limit_2nd_stage = TRANS_SIZE_8;

    /* Inverse Transform 1st stage */
    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);
    {
        /************************************************************************************************/
        /**********************************START - IT_RECON_8x8******************************************/
        /************************************************************************************************/

        for(j = 0; j < row_limit_2nd_stage; j++)
        {
            /* Checking for Zero Cols */
            if((zero_cols & 1) == 1)
            {
                memset(pi2_tmp, 0, trans_size * sizeof(WORD16));
            }
            else
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_src[src_strd]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_src[3 * src_strd]
                                    + g_ai2_ihevc_trans_8[5][k]
                                                    * pi2_src[5 * src_strd]
                                    + g_ai2_ihevc_trans_8[7][k]
                                                    * pi2_src[7 * src_strd];
                }

                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_8[6][0] * pi2_src[6 * src_strd];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_8[6][1] * pi2_src[6 * src_strd];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_src[0]
                                + g_ai2_ihevc_trans_8[4][0] * pi2_src[4 * src_strd];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_src[0]
                                + g_ai2_ihevc_trans_8[4][1] * pi2_src[4 * src_strd];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    pi2_tmp[k] =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pi2_tmp[k + 4] =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                }
            }
            pi2_src++;
            pi2_tmp += trans_size;
            zero_cols = zero_cols >> 1;
        }

        pi2_tmp = pi2_tmp_orig;

        /* Inverse Transform 2nd stage */
        shift = IT_SHIFT_STAGE_2;
        add = 1 << (shift - 1);

        if((zero_rows_2nd_stage & 0xF0) == 0xF0) /* First 4 rows of output of 1st stage are non-zero */
        {
            for(j = 0; j < trans_size; j++)
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_tmp[trans_size]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_tmp[3 * trans_size];
                }
                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_tmp[2 * trans_size];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_tmp[2 * trans_size];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_tmp[0];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_tmp[0];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    WORD32 itrans_out;
                    itrans_out =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pu1_dst[k * 2] = CLIP_U8((itrans_out + pu1_pred[k * 2]));
                    itrans_out =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                    pu1_dst[(k + 4) * 2] =
                                    CLIP_U8((itrans_out + pu1_pred[(k + 4) * 2]));
                }
                pi2_tmp++;
                pu1_pred += pred_strd;
                pu1_dst += dst_strd;
            }
        }
        else /* All rows of output of 1st stage are non-zero */
        {
            for(j = 0; j < trans_size; j++)
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_tmp[trans_size]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_tmp[3 * trans_size]
                                    + g_ai2_ihevc_trans_8[5][k]
                                                    * pi2_tmp[5 * trans_size]
                                    + g_ai2_ihevc_trans_8[7][k]
                                                    * pi2_tmp[7 * trans_size];
                }

                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_tmp[2 * trans_size]
                                + g_ai2_ihevc_trans_8[6][0] * pi2_tmp[6 * trans_size];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_tmp[2 * trans_size]
                                + g_ai2_ihevc_trans_8[6][1] * pi2_tmp[6 * trans_size];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_tmp[0]
                                + g_ai2_ihevc_trans_8[4][0] * pi2_tmp[4 * trans_size];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_tmp[0]
                                + g_ai2_ihevc_trans_8[4][1] * pi2_tmp[4 * trans_size];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    WORD32 itrans_out;
                    itrans_out =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pu1_dst[k * 2] = CLIP_U8((itrans_out + pu1_pred[k * 2]));
                    itrans_out =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                    pu1_dst[(k + 4) * 2] =
                                    CLIP_U8((itrans_out + pu1_pred[(k + 4) * 2]));
                }
                pi2_tmp++;
                pu1_pred += pred_strd;
                pu1_dst += dst_strd;
            }
        }
        /************************************************************************************************/
        /************************************END - IT_RECON_8x8******************************************/
        /************************************************************************************************/
    }
}